

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void fdatasync_cb(uv_fs_t *req)

{
  int iVar1;
  uv_fs_t *puVar2;
  char *handle;
  
  if (req == &fdatasync_req) {
    handle = (char *)req;
    if (fdatasync_req.fs_type != UV_FS_FDATASYNC) goto LAB_0015799d;
    if (fdatasync_req.result != 0) goto LAB_001579a2;
    fdatasync_cb_count = fdatasync_cb_count + 1;
    uv_fs_req_cleanup(&fdatasync_req);
    handle = (char *)loop;
    iVar1 = uv_fs_fsync(loop,&fsync_req,(uv_file)open_req1.result,fsync_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fdatasync_cb_cold_1();
    handle = (char *)req;
LAB_0015799d:
    fdatasync_cb_cold_2();
LAB_001579a2:
    fdatasync_cb_cold_3();
  }
  fdatasync_cb_cold_4();
  if ((uv_fs_t *)handle == &fsync_req) {
    if (fsync_req.fs_type != UV_FS_FSYNC) goto LAB_00157a09;
    if (fsync_req.result != 0) goto LAB_00157a0e;
    fsync_cb_count = fsync_cb_count + 1;
    uv_fs_req_cleanup(&fsync_req);
    handle = (char *)loop;
    iVar1 = uv_fs_close(loop,&close_req,(uv_file)open_req1.result,close_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fsync_cb_cold_1();
LAB_00157a09:
    fsync_cb_cold_2();
LAB_00157a0e:
    fsync_cb_cold_3();
  }
  fsync_cb_cold_4();
  if ((uv_fs_t *)handle == &close_req) {
    if (close_req.fs_type != UV_FS_CLOSE) goto LAB_00157a7f;
    if (close_req.result != 0) goto LAB_00157a84;
    close_cb_count = close_cb_count + 1;
    uv_fs_req_cleanup(&close_req);
    if (close_cb_count != 3) {
      return;
    }
    handle = (char *)loop;
    iVar1 = uv_fs_unlink(loop,&unlink_req,"test_file2",unlink_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    close_cb_cold_1();
LAB_00157a7f:
    close_cb_cold_2();
LAB_00157a84:
    close_cb_cold_3();
  }
  close_cb_cold_4();
  if ((uv_fs_t *)handle == &read_req) {
    if (read_req.fs_type != UV_FS_READ) goto LAB_00157b51;
    if (read_req.result < 0) goto LAB_00157b56;
    read_cb_count = read_cb_count + 1;
    puVar2 = &read_req;
    uv_fs_req_cleanup(&read_req);
    if (read_cb_count == 1) {
      handle = buf;
      iVar1 = strcmp(buf,test_buf);
      if (iVar1 == 0) {
        handle = (char *)loop;
        iVar1 = uv_fs_ftruncate(loop,&ftruncate_req,(uv_file)open_req1.result,7,ftruncate_cb);
        goto LAB_00157b46;
      }
      goto LAB_00157b60;
    }
    handle = (char *)puVar2;
    if (buf._0_8_ == 0x75622d74736574) {
      handle = (char *)loop;
      iVar1 = uv_fs_close(loop,&close_req,(uv_file)open_req1.result,close_cb);
LAB_00157b46:
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00157b5b;
    }
  }
  else {
    read_cb_cold_1();
LAB_00157b51:
    read_cb_cold_2();
LAB_00157b56:
    read_cb_cold_3();
LAB_00157b5b:
    read_cb_cold_6();
LAB_00157b60:
    read_cb_cold_5();
  }
  read_cb_cold_4();
  if ((uv_fs_t *)handle == &ftruncate_req) {
    if (ftruncate_req.fs_type != UV_FS_FTRUNCATE) goto LAB_00157bc7;
    if (ftruncate_req.result == 0) {
      ftruncate_cb_count = ftruncate_cb_count + 1;
      uv_fs_req_cleanup(&ftruncate_req);
      handle = (char *)loop;
      iVar1 = uv_fs_close(loop,&close_req,(uv_file)open_req1.result,close_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00157bd1;
    }
  }
  else {
    ftruncate_cb_cold_1();
LAB_00157bc7:
    ftruncate_cb_cold_2();
  }
  ftruncate_cb_cold_3();
LAB_00157bd1:
  ftruncate_cb_cold_4();
  if (((ulong)((uv_loop_t *)handle)->watcher_queue[0] & 3) != 0) {
    __assert_fail("!uv__is_closing(handle)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/signal.c"
                  ,0x214,"int uv_signal_stop(uv_signal_t *)");
  }
  uv__signal_stop((uv_signal_t *)handle);
  return;
}

Assistant:

static void fdatasync_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &fdatasync_req);
  ASSERT(req->fs_type == UV_FS_FDATASYNC);
  ASSERT(req->result == 0);
  fdatasync_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_fsync(loop, &fsync_req, open_req1.result, fsync_cb);
  ASSERT(r == 0);
}